

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_no_field_presence.pb.cc
# Opt level: O1

void proto2_nofieldpresence_unittest::ForeignMessage::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  Nonnull<const_char_*> pcVar4;
  
  if (from_msg == to_msg) {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 != (Nonnull<const_char_*>)0x0) {
    MergeImpl();
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if (((uVar1 & 1) != 0) && (iVar2 = (int)from_msg[1]._internal_metadata_.ptr_, iVar2 != 0)) {
    *(int *)&to_msg[1]._internal_metadata_.ptr_ = iVar2;
  }
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
  uVar3 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar3 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void ForeignMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<ForeignMessage*>(&to_msg);
  auto& from = static_cast<const ForeignMessage&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_nofieldpresence_unittest.ForeignMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    if (from._internal_c() != 0) {
      _this->_impl_.c_ = from._impl_.c_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}